

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_calculate_frame_count_after_resampling
                    (ma_uint32 sampleRateOut,ma_uint32 sampleRateIn,ma_uint64 frameCountIn)

{
  ulong uVar1;
  
  if (frameCountIn == 0 || (sampleRateOut == 0 || sampleRateIn == 0)) {
    frameCountIn = 0;
  }
  else if (sampleRateOut != sampleRateIn) {
    uVar1 = (sampleRateOut * frameCountIn) / (ulong)sampleRateIn;
    frameCountIn = (uVar1 + 1) -
                   (ulong)(frameCountIn <
                          ((ulong)sampleRateIn % (ulong)sampleRateOut) * uVar1 +
                          (((ulong)sampleRateIn / (ulong)sampleRateOut) * uVar1) /
                          (ulong)sampleRateOut);
  }
  return frameCountIn;
}

Assistant:

MA_API ma_uint64 ma_calculate_frame_count_after_resampling(ma_uint32 sampleRateOut, ma_uint32 sampleRateIn, ma_uint64 frameCountIn)
{
    /* This is based on the calculation in ma_linear_resampler_get_expected_output_frame_count(). */
    ma_uint64 outputFrameCount;
    ma_uint64 preliminaryInputFrameCountFromFrac;
    ma_uint64 preliminaryInputFrameCount;

    if (sampleRateIn == 0 || sampleRateOut == 0 || frameCountIn == 0) {
        return 0;
    }

    if (sampleRateOut == sampleRateIn) {
        return frameCountIn;
    }

    outputFrameCount = (frameCountIn * sampleRateOut) / sampleRateIn;

    preliminaryInputFrameCountFromFrac = (outputFrameCount * (sampleRateIn / sampleRateOut)) / sampleRateOut;
    preliminaryInputFrameCount         = (outputFrameCount * (sampleRateIn % sampleRateOut)) + preliminaryInputFrameCountFromFrac;

    if (preliminaryInputFrameCount <= frameCountIn) {
        outputFrameCount += 1;
    }

    return outputFrameCount;
}